

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::~CGUIListBox(CGUIListBox *this)

{
  ~CGUIListBox((CGUIListBox *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)));
  return;
}

Assistant:

CGUIListBox::~CGUIListBox()
{
	if (ScrollBar)
		ScrollBar->drop();

	if (Font)
		Font->drop();

	if (IconBank)
		IconBank->drop();
}